

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu-graphics.cpp
# Opt level: O1

string * Game::Graphics::Menu::MainMenuOptionsPrompt_abi_cxx11_(void)

{
  char *__s;
  size_t sVar1;
  long lVar2;
  string *in_RDI;
  ostringstream str_os;
  undefined1 auStack_1b8 [8];
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  lVar2 = 0;
  local_1b0 = in_RDI;
  do {
    __s = *(char **)((long)&PTR_anon_var_dwarf_79413_0011ad30 + lVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"        ",8);
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x10);
    }
    else {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return local_1b0;
}

Assistant:

std::string MainMenuOptionsPrompt() {
  const auto menu_list_txt = {"1. Play a New Game", "2. Continue Previous Game",
                              "3. View Highscores and Statistics", "4. Exit"};
  constexpr auto sp = "        ";

  std::ostringstream str_os;

  str_os << "\n";
  for (const auto txt : menu_list_txt) {
    str_os << sp << txt << "\n";
  }
  str_os << "\n";

  return str_os.str();
}